

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat.c
# Opt level: O3

int Cbs_ManPropagate(Cbs_Man_t *p,int Level)

{
  Gia_Obj_t *pGVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  Gia_Obj_t **ppGVar6;
  ulong uVar7;
  Gia_Obj_t *pGVar8;
  Gia_Obj_t *pGVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  size_t __size;
  Gia_Obj_t *pGVar13;
  uint uVar14;
  int iVar16;
  long lVar17;
  ulong uVar15;
  
  do {
    iVar16 = (p->pProp).iHead;
    lVar17 = (long)iVar16;
    uVar11 = (p->pProp).iTail;
    uVar7 = (ulong)uVar11;
    if (iVar16 < (int)uVar11) {
      do {
        uVar11 = (uint)uVar7;
        pGVar1 = (p->pProp).pData[lVar17];
        if (pGVar1 == (Gia_Obj_t *)0x0) break;
        if (((ulong)pGVar1 & 1) != 0) {
          __assert_fail("!Gia_IsComplement(pVar)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat.c"
                        ,0x2ed,"int Cbs_ManPropagateOne(Cbs_Man_t *, Gia_Obj_t *, int)");
        }
        uVar7 = *(ulong *)pGVar1;
        uVar11 = (uint)uVar7;
        if ((uVar11 >> 0x1e & 1) == 0) {
          __assert_fail("Cbs_VarIsAssigned(pVar)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat.c"
                        ,0x2ee,"int Cbs_ManPropagateOne(Cbs_Man_t *, Gia_Obj_t *, int)");
        }
        if ((~uVar11 & 0x9fffffff) != 0) {
          if (((int)uVar11 < 0) || (uVar2 = uVar11 & 0x1fffffff, uVar2 == 0x1fffffff)) {
            __assert_fail("Gia_ObjIsAnd(pVar)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat.c"
                          ,0x2f1,"int Cbs_ManPropagateOne(Cbs_Man_t *, Gia_Obj_t *, int)");
          }
          uVar10 = ((uint)(uVar7 >> 0x1d) & 7 ^
                   (uint)((ulong)*(undefined8 *)(pGVar1 + -(ulong)uVar2) >> 0x3e)) & 1;
          uVar3 = (uint)*(undefined8 *)(pGVar1 + -(ulong)uVar2);
          if ((uVar3 >> 0x1e & 1) == 0) {
            uVar10 = 2;
          }
          uVar14 = (uint)(uVar7 >> 0x20);
          uVar15 = (ulong)(uVar14 & 0x1fffffff);
          uVar12 = (uint)*(undefined8 *)(pGVar1 + -uVar15);
          uVar14 = (uVar14 >> 0x1d ^ (uint)((ulong)*(undefined8 *)(pGVar1 + -uVar15) >> 0x3e)) & 1;
          if ((uVar12 >> 0x1e & 1) == 0) {
            uVar14 = 2;
          }
          if ((uVar11 >> 0x1e & 1) == 0) goto LAB_0071c0c7;
          pGVar9 = pGVar1 + -(ulong)uVar2;
          pGVar13 = pGVar1 + -uVar15;
          if ((uVar7 & 0x4000000000000000) == 0) {
            if (uVar14 != 0 && uVar10 != 0) {
              if ((uVar10 == 1) && (uVar14 == 1)) goto LAB_0071be86;
              if ((uVar10 == 1) || (uVar14 == 1)) {
                if ((uVar3 >> 0x1e & 1) == 0) {
                  Cbs_ManAssign(p,(Gia_Obj_t *)(((ulong)(uVar11 >> 0x1d & 1) | (ulong)pGVar9) ^ 1),
                                Level,pGVar1,pGVar13);
                }
                if ((uVar12 >> 0x1e & 1) == 0) {
                  uVar7 = *(ulong *)pGVar1;
                  pGVar13 = (Gia_Obj_t *)
                            (((ulong)((uint)(uVar7 >> 0x3d) & 1) |
                             (ulong)(pGVar1 + -(uVar7 >> 0x20 & 0x1fffffff))) ^ 1);
                  pGVar9 = pGVar1 + -(uVar7 & 0x1fffffff);
                  goto LAB_0071bdd1;
                }
              }
              else {
                if (((uVar3 | uVar12) >> 0x1e & 1) != 0) {
                  __assert_fail("Cbs_VarIsJust(pVar)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat.c"
                                ,0x312,"int Cbs_ManPropagateOne(Cbs_Man_t *, Gia_Obj_t *, int)");
                }
                iVar16 = (p->pJust).iHead;
                lVar5 = (long)iVar16;
                iVar4 = (p->pJust).iTail;
                if (iVar16 < iVar4) {
                  do {
                    pGVar9 = (p->pJust).pData[lVar5];
                    if (pGVar9 == (Gia_Obj_t *)0x0) break;
                    if (pGVar9 == pGVar1) {
                      __assert_fail("!Cbs_QueHasNode( &p->pJust, pVar )",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat.c"
                                    ,0x313,"int Cbs_ManPropagateOne(Cbs_Man_t *, Gia_Obj_t *, int)")
                      ;
                    }
                    lVar5 = lVar5 + 1;
                  } while (iVar4 != lVar5);
                }
                if (iVar4 == (p->pJust).nSize) {
                  (p->pJust).nSize = iVar4 * 2;
                  ppGVar6 = (p->pJust).pData;
                  __size = (long)iVar4 << 4;
                  if (ppGVar6 == (Gia_Obj_t **)0x0) {
                    ppGVar6 = (Gia_Obj_t **)malloc(__size);
                  }
                  else {
                    ppGVar6 = (Gia_Obj_t **)realloc(ppGVar6,__size);
                    iVar4 = (p->pJust).iTail;
                  }
                  (p->pJust).pData = ppGVar6;
                }
                else {
                  ppGVar6 = (p->pJust).pData;
                }
                (p->pJust).iTail = iVar4 + 1;
                ppGVar6[iVar4] = pGVar1;
              }
            }
          }
          else if (uVar14 != 0 && uVar10 != 0) {
            if ((uVar3 >> 0x1e & 1) == 0) {
              Cbs_ManAssign(p,(Gia_Obj_t *)((ulong)(uVar11 >> 0x1d & 1) | (ulong)pGVar9),Level,
                            pGVar1,(Gia_Obj_t *)0x0);
            }
            if ((uVar12 >> 0x1e & 1) == 0) {
              uVar11 = (uint)((ulong)*(undefined8 *)pGVar1 >> 0x20);
              pGVar13 = (Gia_Obj_t *)
                        ((ulong)(uVar11 >> 0x1d & 1) |
                        (ulong)(pGVar1 + -(ulong)(uVar11 & 0x1fffffff)));
              pGVar9 = (Gia_Obj_t *)0x0;
LAB_0071bdd1:
              Cbs_ManAssign(p,pGVar13,Level,pGVar1,pGVar9);
            }
          }
          else {
            if (((uVar10 == 0) && (pGVar8 = pGVar9, uVar14 != 0)) ||
               ((uVar10 != 0 && (pGVar8 = pGVar13, uVar14 == 0)))) {
              pGVar13 = (Gia_Obj_t *)0x0;
              pGVar9 = pGVar8;
            }
            else if (uVar10 != 0 || uVar14 != 0) {
              __assert_fail("Value0 == 0 && Value1 == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat.c"
                            ,0x2fc,"int Cbs_ManPropagateOne(Cbs_Man_t *, Gia_Obj_t *, int)");
            }
LAB_0071be86:
            iVar16 = Cbs_ManAnalyze(p,Level,pGVar1,pGVar9,pGVar13);
            if (iVar16 != 0) {
              return iVar16;
            }
          }
        }
        lVar17 = lVar17 + 1;
        uVar11 = (p->pProp).iTail;
        uVar7 = (ulong)(int)uVar11;
      } while (lVar17 < (long)uVar7);
    }
    (p->pProp).iHead = uVar11;
    iVar16 = (p->pJust).iHead;
    iVar4 = (p->pJust).iTail;
    if (iVar16 < iVar4) {
      lVar17 = (long)iVar16;
      ppGVar6 = (p->pJust).pData;
      pGVar1 = ppGVar6[lVar17];
      while (pGVar1 != (Gia_Obj_t *)0x0) {
        lVar17 = lVar17 + 1;
        uVar7 = *(ulong *)pGVar1;
        uVar11 = (uint)uVar7;
        if (((int)uVar11 < 0) || (uVar2 = uVar11 & 0x1fffffff, uVar2 == 0x1fffffff)) {
          if (((ulong)pGVar1 & 1) == 0) {
            __assert_fail("Gia_ObjIsAnd(pVar)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat.c"
                          ,0x327,"int Cbs_ManPropagateTwo(Cbs_Man_t *, Gia_Obj_t *, int)");
          }
LAB_0071c149:
          __assert_fail("!Gia_IsComplement(pVar)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat.c"
                        ,0x326,"int Cbs_ManPropagateTwo(Cbs_Man_t *, Gia_Obj_t *, int)");
        }
        uVar3 = (uint)*(undefined8 *)(pGVar1 + -(ulong)uVar2);
        uVar10 = (uint)(uVar7 >> 0x20);
        if (((uVar3 >> 0x1e & 1) == 0) &&
           ((pGVar1[-(ulong)(uVar10 & 0x1fffffff)].field_0x3 & 0x40) == 0)) {
          lVar5 = (long)iVar16;
          iVar16 = iVar16 + 1;
          ppGVar6[lVar5] = pGVar1;
        }
        else {
          if (((ulong)pGVar1 & 1) != 0) goto LAB_0071c149;
          if (uVar11 < 0x40000000) {
            __assert_fail("Cbs_VarIsAssigned(pVar)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat.c"
                          ,0x328,"int Cbs_ManPropagateTwo(Cbs_Man_t *, Gia_Obj_t *, int)");
          }
          if ((uVar11 >> 0x1e & 1) == 0) {
LAB_0071c0c7:
            __assert_fail("pVar->fMark0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat.c"
                          ,0x5d,"int Cbs_VarValue(Gia_Obj_t *)");
          }
          if ((uVar7 & 0x4000000000000000) != 0) {
            __assert_fail("!Cbs_VarValue(pVar)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat.c"
                          ,0x329,"int Cbs_ManPropagateTwo(Cbs_Man_t *, Gia_Obj_t *, int)");
          }
          uVar11 = ((uint)(uVar7 >> 0x1d) & 7 ^
                   (uint)((ulong)*(undefined8 *)(pGVar1 + -(ulong)uVar2) >> 0x3e)) & 1;
          if ((uVar3 >> 0x1e & 1) == 0) {
            uVar11 = 2;
          }
          uVar12 = (uint)*(undefined8 *)(pGVar1 + -(ulong)(uVar10 & 0x1fffffff));
          uVar14 = (uVar10 >> 0x1d ^
                   (uint)((ulong)*(undefined8 *)(pGVar1 + -(ulong)(uVar10 & 0x1fffffff)) >> 0x3e)) &
                   1;
          if ((uVar12 >> 0x1e & 1) == 0) {
            uVar14 = 2;
          }
          if ((uVar11 != 0) && (uVar14 != 0)) {
            if ((uVar11 == 1) && (uVar14 == 1)) {
              iVar4 = Cbs_ManAnalyze(p,Level,pGVar1,pGVar1 + -(ulong)uVar2,
                                     pGVar1 + -(ulong)(uVar10 & 0x1fffffff));
              if (iVar4 != 0) {
                return iVar4;
              }
            }
            else {
              if ((uVar11 != 1) && (uVar14 != 1)) {
                __assert_fail("Value0 == 1 || Value1 == 1",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat.c"
                              ,0x331,"int Cbs_ManPropagateTwo(Cbs_Man_t *, Gia_Obj_t *, int)");
              }
              if ((uVar3 >> 0x1e & 1) == 0) {
                Cbs_ManAssign(p,(Gia_Obj_t *)
                                (((ulong)((uint)(uVar7 >> 0x1d) & 1) |
                                 (ulong)(pGVar1 + -(ulong)uVar2)) ^ 1),Level,pGVar1,
                              pGVar1 + -(ulong)(uVar10 & 0x1fffffff));
              }
              if ((uVar12 >> 0x1e & 1) == 0) {
                uVar7 = *(ulong *)pGVar1;
                Cbs_ManAssign(p,(Gia_Obj_t *)
                                (((ulong)((uint)(uVar7 >> 0x3d) & 1) |
                                 (ulong)(pGVar1 + -(uVar7 >> 0x20 & 0x1fffffff))) ^ 1),Level,pGVar1,
                              pGVar1 + -(uVar7 & 0x1fffffff));
              }
            }
          }
        }
        iVar4 = (p->pJust).iTail;
        if (iVar4 <= lVar17) break;
        ppGVar6 = (p->pJust).pData;
        pGVar1 = ppGVar6[lVar17];
      }
    }
    if (iVar16 == iVar4) {
      return 0;
    }
    (p->pJust).iTail = iVar16;
  } while( true );
}

Assistant:

int Cbs_ManPropagate( Cbs_Man_t * p, int Level )
{
    int hClause;
    Gia_Obj_t * pVar;
    int i, k;
    while ( 1 )
    {
        Cbs_QueForEachEntry( p->pProp, pVar, i )
        {
            if ( (hClause = Cbs_ManPropagateOne( p, pVar, Level )) )
                return hClause;
        }
        p->pProp.iHead = p->pProp.iTail;
        k = p->pJust.iHead;
        Cbs_QueForEachEntry( p->pJust, pVar, i )
        {
            if ( Cbs_VarIsJust( pVar ) )
                p->pJust.pData[k++] = pVar;
            else if ( (hClause = Cbs_ManPropagateTwo( p, pVar, Level )) )
                return hClause;
        }
        if ( k == p->pJust.iTail )
            break;
        p->pJust.iTail = k;
    }
    return 0;
}